

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O0

void __thiscall HydEngine::initMatrixSolver(HydEngine *this)

{
  uint uVar1;
  value_type vVar2;
  MatrixSolver *pMVar3;
  uint uVar4;
  int iVar5;
  size_type sVar6;
  undefined4 extraout_var;
  uint *puVar7;
  undefined4 extraout_var_00;
  reference pvVar8;
  reference pvVar9;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  uint local_68;
  allocator<int> local_61;
  int k;
  vector<int,_std::allocator<int>_> node2;
  allocator<int> local_31;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> node1;
  int linkCount;
  int nodeCount;
  HydEngine *this_local;
  
  node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = Network::count(this->network,NODE);
  node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = Network::count(this->network,LINK);
  sVar6 = (size_type)
          (int)(uint)node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  std::allocator<int>::allocator(&local_31);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,sVar6,&local_31);
  std::allocator<int>::~allocator(&local_31);
  sVar6 = (size_type)
          (int)(uint)node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
  std::allocator<int>::allocator(&local_61);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&k,sVar6,&local_61);
  std::allocator<int>::~allocator(&local_61);
  __to = extraout_RDX;
  for (local_68 = 0;
      uVar4 = node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._4_4_,
      uVar1 = (uint)node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
      (int)local_68 <
      (int)(uint)node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage; local_68 = local_68 + 1) {
    iVar5 = Network::link(this->network,(char *)(ulong)local_68,__to);
    uVar1 = *(uint *)(*(long *)(CONCAT44(extraout_var,iVar5) + 0x30) + 0x28);
    puVar7 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_30,(long)(int)local_68);
    *puVar7 = uVar1;
    iVar5 = Network::link(this->network,(char *)(ulong)local_68,(char *)(ulong)uVar1);
    vVar2 = *(value_type *)(*(long *)(CONCAT44(extraout_var_00,iVar5) + 0x38) + 0x28);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&k,(long)(int)local_68);
    *pvVar8 = vVar2;
    __to = extraout_RDX_00;
  }
  pMVar3 = this->matrixSolver;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_30,0);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&k,0);
  (*pMVar3->_vptr_MatrixSolver[2])(pMVar3,(ulong)uVar4,(ulong)uVar1,pvVar8,pvVar9);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&k);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return;
}

Assistant:

void HydEngine::initMatrixSolver()
{
    int nodeCount = network->count(Element::NODE);
    int linkCount = network->count(Element::LINK);
    try
    {
        // ... place the start/end node indexes of each network link in arrays

        vector<int> node1(linkCount);
        vector<int> node2(linkCount);
        for (int k = 0; k < linkCount; k++)
        {
            node1[k] = network->link(k)->fromNode->index;
            node2[k] = network->link(k)->toNode->index;
        }

        // ...  initialize the matrix solver

        matrixSolver->init(nodeCount, linkCount, (int *)&node1[0], (int *)&node2[0]);
    }
    catch (...)
    {
        throw;
    }
}